

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.h
# Opt level: O1

void gimage::addScaledNoise<float>(Image<float,_gimage::PixelTraits<float>_> *image,float stddev)

{
  float *pfVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (0 < image->depth) {
    lVar6 = 0;
    do {
      if (0 < image->height) {
        lVar4 = 0;
        do {
          if (0 < image->width) {
            uVar5 = 0;
            do {
              do {
                do {
                  iVar2 = rand();
                  dVar9 = ((double)iVar2 + (double)iVar2) / 2147483647.0 + -1.0;
                  iVar2 = rand();
                  dVar10 = ((double)iVar2 + (double)iVar2) / 2147483647.0 + -1.0;
                  dVar7 = dVar9 * dVar9 + dVar10 * dVar10;
                } while (dVar7 == 0.0);
              } while (1.0 <= dVar7);
              dVar8 = log(dVar7);
              dVar7 = (dVar8 * -2.0) / dVar7;
              if (dVar7 < 0.0) {
                dVar7 = sqrt(dVar7);
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              pfVar1 = image->img[(int)lVar6][lVar4];
              dVar9 = (dVar9 * dVar7 * (double)stddev * (double)pfVar1[uVar5]) /
                      3.4028234663852886e+38 + (double)pfVar1[uVar5];
              if (3.4028234663852886e+38 <= dVar9) {
                dVar9 = 3.4028234663852886e+38;
              }
              if (dVar9 <= -3.4028234663852886e+38) {
                dVar9 = -3.4028234663852886e+38;
              }
              pfVar1[uVar5] = (float)dVar9;
              uVar3 = uVar5 | 1;
              if ((long)uVar3 < image->width) {
                dVar7 = (dVar10 * dVar7 * (double)stddev * (double)pfVar1[uVar3]) /
                        3.4028234663852886e+38 + (double)pfVar1[uVar3];
                if (3.4028234663852886e+38 <= dVar7) {
                  dVar7 = 3.4028234663852886e+38;
                }
                if (dVar7 <= -3.4028234663852886e+38) {
                  dVar7 = -3.4028234663852886e+38;
                }
                pfVar1[uVar3] = (float)dVar7;
              }
              uVar5 = uVar5 + 2;
            } while ((long)uVar5 < image->width);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < image->height);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < image->depth);
  }
  return;
}

Assistant:

void addScaledNoise(Image<T> &image, float stddev)
{
  double vmin=image.absMinValue();
  double vmax=image.absMaxValue();

  for (long d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        double r1, r2;
        getBoxMuller(r1, r2, stddev);

        double v=image.get(i, k, d);
        v=std::max(vmin, std::min(vmax, v+r1*v/vmax));
        image.set(i, k, d, static_cast<typename Image<T>::store_t>(v));

        if (i+1 < image.getWidth())
        {
          v=image.get(i+1, k, d);
          v=std::max(vmin, std::min(vmax, v+r2*v/vmax));
          image.set(i+1, k, d, static_cast<typename Image<T>::store_t>(v));
        }
      }
    }
  }
}